

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacon2.c
# Opt level: O3

int slacon2_(int *n,float *v,float *x,int *isgn,float *est,int *kase,int *isave)

{
  uint uVar1;
  undefined1 auVar2 [16];
  integer iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  float fVar7;
  real rVar8;
  undefined4 extraout_XMM0_Db;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  integer local_50;
  float local_4c;
  undefined8 local_48;
  long lVar12;
  
  auVar2 = _DAT_00113450;
  local_50 = 1;
  if (*kase == 0) {
    iVar6 = *n;
    if (0 < (long)iVar6) {
      fVar7 = 1.0 / (float)iVar6;
      lVar4 = (long)iVar6 + -1;
      auVar9._8_4_ = (int)lVar4;
      auVar9._0_8_ = lVar4;
      auVar9._12_4_ = (int)((ulong)lVar4 >> 0x20);
      lVar4 = 0;
      auVar9 = auVar9 ^ _DAT_00113450;
      auVar11 = _DAT_00113430;
      auVar13 = _DAT_00113440;
      do {
        auVar14 = auVar13 ^ auVar2;
        iVar10 = auVar9._4_4_;
        if ((bool)(~(auVar14._4_4_ == iVar10 && auVar9._0_4_ < auVar14._0_4_ ||
                    iVar10 < auVar14._4_4_) & 1)) {
          *(float *)((long)x + lVar4) = fVar7;
        }
        if ((auVar14._12_4_ != auVar9._12_4_ || auVar14._8_4_ <= auVar9._8_4_) &&
            auVar14._12_4_ <= auVar9._12_4_) {
          *(float *)((long)x + lVar4 + 4) = fVar7;
        }
        auVar14 = auVar11 ^ auVar2;
        iVar15 = auVar14._4_4_;
        if (iVar15 <= iVar10 && (iVar15 != iVar10 || auVar14._0_4_ <= auVar9._0_4_)) {
          *(float *)((long)x + lVar4 + 8) = fVar7;
          *(float *)((long)x + lVar4 + 0xc) = fVar7;
        }
        lVar12 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 4;
        auVar13._8_8_ = lVar12 + 4;
        lVar12 = auVar11._8_8_;
        auVar11._0_8_ = auVar11._0_8_ + 4;
        auVar11._8_8_ = lVar12 + 4;
        lVar4 = lVar4 + 0x10;
      } while ((ulong)(iVar6 + 3U >> 2) << 4 != lVar4);
    }
    *kase = 1;
    *isave = 1;
    return 0;
  }
  switch(*isave) {
  case 2:
    iVar3 = isamax_(n,x,&local_50);
    iVar6 = iVar3 + -1;
    isave[1] = iVar6;
    isave[2] = 2;
LAB_001103ff:
    if (0 < (long)*n) {
      memset(x,0,(long)*n << 2);
    }
    x[iVar6] = 1.0;
    *kase = 1;
    *isave = 3;
    return 0;
  case 3:
    local_48 = kase;
    scopy_(n,x,&local_50,v,&local_50);
    kase = local_48;
    local_4c = *est;
    rVar8 = sasum_(n,v,&local_50);
    *est = rVar8;
    if ((long)*n < 1) goto LAB_00110661;
    lVar4 = 0;
    do {
      if ((*(double *)(&DAT_00114c20 + (ulong)(x[lVar4] < 0.0) * 8) != (double)isgn[lVar4]) ||
         (NAN(*(double *)(&DAT_00114c20 + (ulong)(x[lVar4] < 0.0) * 8)) || NAN((double)isgn[lVar4]))
         ) {
        if (local_4c < rVar8) {
          lVar4 = 0;
          do {
            fVar7 = x[lVar4];
            x[lVar4] = *(float *)(&DAT_00114c30 + (ulong)(fVar7 < 0.0) * 4);
            isgn[lVar4] = -(uint)(fVar7 < 0.0) | 1;
            lVar4 = lVar4 + 1;
          } while (lVar4 < *n);
          *kase = 2;
          *isave = 4;
          return 0;
        }
        break;
      }
      lVar4 = lVar4 + 1;
    } while (*n != lVar4);
    break;
  case 4:
    iVar10 = isave[1];
    iVar3 = isamax_(n,x,&local_50);
    iVar6 = iVar3 + -1;
    isave[1] = iVar6;
    if (((x[iVar10] != ABS(x[(long)iVar3 + -1])) ||
        (NAN(x[iVar10]) || NAN(ABS(x[(long)iVar3 + -1])))) && (isave[2] < 5)) {
      isave[2] = isave[2] + 1;
      goto LAB_001103ff;
    }
    break;
  case 5:
    rVar8 = sasum_(n,x,&local_50);
    fVar7 = rVar8 / (float)(*n * 3);
    fVar7 = fVar7 + fVar7;
    if (fVar7 < *est || fVar7 == *est) goto LAB_00110540;
    local_48 = (int *)CONCAT44(extraout_XMM0_Db,fVar7);
    scopy_(n,x,&local_50,v,&local_50);
    goto LAB_0011053a;
  default:
    if (*n != 1) {
      rVar8 = sasum_(n,x,&local_50);
      *est = rVar8;
      if (0 < *n) {
        lVar4 = 0;
        do {
          fVar7 = x[lVar4];
          x[lVar4] = *(float *)(&DAT_00114c30 + (ulong)(fVar7 < 0.0) * 4);
          isgn[lVar4] = -(uint)(fVar7 < 0.0) | 1;
          lVar4 = lVar4 + 1;
        } while (lVar4 < *n);
      }
      *kase = 2;
      *isave = 2;
      return 0;
    }
    local_48._0_4_ = *x;
    *v = (float)local_48;
    local_48._0_4_ = ABS((float)local_48);
LAB_0011053a:
    *est = (float)local_48;
LAB_00110540:
    *kase = 0;
    return 0;
  }
  uVar1 = *n;
  if (0 < (int)uVar1) {
    fVar7 = 1.0;
    uVar5 = 0;
    do {
      x[uVar5] = ((float)(int)uVar5 / (float)(int)(uVar1 - 1) + 1.0) * fVar7;
      fVar7 = -fVar7;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
LAB_00110661:
  *kase = 1;
  *isave = 5;
  return 0;
}

Assistant:

int
slacon2_(int *n, float *v, float *x, int *isgn, float *est, int *kase, int isave[3])
{
    /* Table of constant values */
    int c__1 = 1;
    float      zero = 0.0;
    float      one = 1.0;
    
    /* Local variables */
    int jlast;
    float altsgn, estold;
    int i;
    float temp;
#ifdef _CRAY
    extern int ISAMAX(int *, float *, int *);
    extern float SASUM(int *, float *, int *);
    extern int SCOPY(int *, float *, int *, float *, int *);
#else
    extern int isamax_(int *, float *, int *);
    extern float sasum_(int *, float *, int *);
    extern void scopy_(int *, float *, int *, float *, int *);
#endif
#define d_sign(a, b) (b >= 0 ? fabs(a) : -fabs(a))    /* Copy sign */
#define i_dnnt(a) \
	( a>=0 ? floor(a+.5) : -floor(.5-a) ) /* Round to nearest integer */

    if ( *kase == 0 ) {
	for (i = 0; i < *n; ++i) {
	    x[i] = 1. / (float) (*n);
	}
	*kase = 1;
	isave[0] = 1;	/* jump = 1; */
	return 0;
    }

    switch (isave[0]) {
	case 1:  goto L20;
	case 2:  goto L40;
	case 3:  goto L70;
	case 4:  goto L110;
	case 5:  goto L140;
    }

    /*     ................ ENTRY   (isave[0] == 1)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY A*X. */
  L20:
    if (*n == 1) {
	v[0] = x[0];
	*est = fabs(v[0]);
	/*        ... QUIT */
	goto L150;
    }
#ifdef _CRAY
    *est = SASUM(n, x, &c__1);
#else
    *est = sasum_(n, x, &c__1);
#endif

    for (i = 0; i < *n; ++i) {
	x[i] = d_sign(one, x[i]);
	isgn[i] = i_dnnt(x[i]);
    }
    *kase = 2;
    isave[0] = 2;  /* jump = 2; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 2)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L40:
#ifdef _CRAY
    isave[1] = ISAMAX(n, &x[0], &c__1);  /* j */
#else
    isave[1] = isamax_(n, &x[0], &c__1);  /* j */
#endif
    --isave[1];  /* --j; */
    isave[2] = 2; /* iter = 2; */

    /*     MAIN LOOP - ITERATIONS 2,3,...,ITMAX. */
L50:
    for (i = 0; i < *n; ++i) x[i] = zero;
    x[isave[1]] = one;
    *kase = 1;
    isave[0] = 3;  /* jump = 3; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 3)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L70:
#ifdef _CRAY
    SCOPY(n, x, &c__1, v, &c__1);
#else
    scopy_(n, x, &c__1, v, &c__1);
#endif
    estold = *est;
#ifdef _CRAY
    *est = SASUM(n, v, &c__1);
#else
    *est = sasum_(n, v, &c__1);
#endif

    for (i = 0; i < *n; ++i)
	if (i_dnnt(d_sign(one, x[i])) != isgn[i])
	    goto L90;

    /*     REPEATED SIGN VECTOR DETECTED, HENCE ALGORITHM HAS CONVERGED. */
    goto L120;

L90:
    /*     TEST FOR CYCLING. */
    if (*est <= estold) goto L120;

    for (i = 0; i < *n; ++i) {
	x[i] = d_sign(one, x[i]);
	isgn[i] = i_dnnt(x[i]);
    }
    *kase = 2;
    isave[0] = 4;  /* jump = 4; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 4)
	   X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L110:
    jlast = isave[1];  /* j; */
#ifdef _CRAY
    isave[1] = ISAMAX(n, &x[0], &c__1);/* j */
#else
    isave[1] = isamax_(n, &x[0], &c__1);  /* j */
#endif
    isave[1] = isave[1] - 1;  /* --j; */
    if (x[jlast] != fabs(x[isave[1]]) && isave[2] < 5) {
	isave[2] = isave[2] + 1;  /* ++iter; */
	goto L50;
    }

    /*     ITERATION COMPLETE.  FINAL STAGE. */
L120:
    altsgn = 1.;
    for (i = 1; i <= *n; ++i) {
	x[i-1] = altsgn * ((float)(i - 1) / (float)(*n - 1) + 1.);
	altsgn = -altsgn;
    }
    *kase = 1;
    isave[0] = 5;  /* jump = 5; */
    return 0;
    
    /*     ................ ENTRY   (isave[0] = 5)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L140:
#ifdef _CRAY
    temp = SASUM(n, x, &c__1) / (float)(*n * 3) * 2.;
#else
    temp = sasum_(n, x, &c__1) / (float)(*n * 3) * 2.;
#endif
    if (temp > *est) {
#ifdef _CRAY
	SCOPY(n, &x[0], &c__1, &v[0], &c__1);
#else
	scopy_(n, &x[0], &c__1, &v[0], &c__1);
#endif
	*est = temp;
    }

L150:
    *kase = 0;
    return 0;

}